

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Data_Query_PDU::Decode(Data_Query_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  KUINT16 KVar2;
  KException *this_01;
  int iVar3;
  undefined7 in_register_00000011;
  KUINT16 i_1;
  KUINT16 i;
  ushort uVar4;
  allocator<char> local_59;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  KUINT32 tmp;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x27 < iVar3 + (uint)KVar2) {
    puVar1 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    puVar1 = (this->m_vVariableDatum).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    local_58 = &this->m_vVariableDatum;
    Simulation_Management_Header::Decode
              (&this->super_Simulation_Management_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RequestID);
    (*(this->m_TimeInterval).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_TimeInterval,stream)
    ;
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumFixedDatum);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumVariableDatum);
    tmp = 0;
    for (uVar4 = 0; this_00 = local_58, (uint)uVar4 < this->m_ui32NumFixedDatum; uVar4 = uVar4 + 1)
    {
      KDataStream::Read<unsigned_int>(stream,&tmp);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_vFixedDatum,&tmp)
      ;
    }
    for (uVar4 = 0; (uint)uVar4 < this->m_ui32NumVariableDatum; uVar4 = uVar4 + 1) {
      KDataStream::Read<unsigned_int>(stream,&tmp);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&tmp);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"Decode",&local_59);
  KException::KException(this_01,(KString *)&tmp,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Data_Query_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DATA_QUERY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vFixedDatum.clear();
    m_vVariableDatum.clear();

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32RequestID
           >> KDIS_STREAM m_TimeInterval
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    KUINT32 tmp = 0;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        stream >> tmp;
        m_vFixedDatum.push_back( tmp );
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        stream >> tmp;
        m_vVariableDatum.push_back( tmp );
    }
}